

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  mesh_t *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  pointer *ppiVar1;
  pointer *ppuVar2;
  pointer __args;
  pointer pfVar3;
  undefined8 uVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  pointer p_Var9;
  pointer p_Var10;
  bool bVar11;
  int iVar12;
  int iVar13;
  pointer pfVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pvVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  pointer __x;
  bool bVar24;
  ulong uVar25;
  pointer pvVar26;
  undefined7 in_register_00000089;
  real_t *prVar27;
  size_t k;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  face_t remainingFace;
  float local_ec [2];
  real_t vy [3];
  float local_b4 [2];
  real_t vx [3];
  vertex_index_t ind [3];
  index_t idx0;
  index_t idx1;
  index_t idx2;
  int local_38;
  uchar local_31;
  int material_id_local;
  
  uVar18 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  if (((prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    p_Var10 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    vy[1] = (real_t)CONCAT71((int7)((ulong)p_Var10 >> 8),
                             p_Var10 ==
                             (prim_group->pointsGroup).
                             super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    vy[1] = 0.0;
  }
  if (SUB41(vy[1],0) == '\0') {
    local_38 = material_id;
    std::__cxx11::string::_M_assign((string *)shape);
    if ((prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pfVar14 = (prim_group->faceGroup).
                super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((prim_group->faceGroup).
          super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar14) {
        this = &shape->mesh;
        this_00 = &(shape->mesh).num_face_vertices;
        this_01 = &(shape->mesh).material_ids;
        this_02 = &(shape->mesh).smoothing_group_ids;
        uVar32 = 0;
        vy[2] = (real_t)CONCAT71(in_register_00000089,triangulate);
        do {
          pvVar17 = pfVar14[uVar32].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)pfVar14[uVar32].vertex_indices.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 2;
          uVar21 = lVar20 * -0x5555555555555555;
          if (2 < uVar21) {
            __args = pfVar14 + uVar32;
            __x = (pointer)&pfVar14[uVar32].vertex_indices;
            remainingFace.vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = __x;
            if ((char)uVar18 == '\0') {
              lVar20 = 8;
              uVar25 = uVar21;
              do {
                lVar31 = *(long *)__x;
                vx[1] = *(real_t *)(lVar31 + -8 + lVar20);
                vx[2] = *(real_t *)(lVar31 + lVar20);
                ind[0].v_idx = *(int *)(lVar31 + -4 + lVar20);
                iVar5._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>
                            ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar5
                             ,(index_t *)(vx + 1));
                  __x = remainingFace.vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  (iVar5._M_current)->texcoord_index = ind[0].v_idx;
                  (iVar5._M_current)->vertex_index = (int)vx[1];
                  (iVar5._M_current)->normal_index = (int)vx[2];
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                lVar20 = lVar20 + 0xc;
                uVar25 = uVar25 - 1;
              } while (uVar25 != 0);
              vx[1] = (real_t)CONCAT31(vx[1]._1_3_,(uchar)uVar21);
              iVar6._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(this_00,iVar6,(uchar *)(vx + 1));
              }
              else {
                *iVar6._M_current = (uchar)uVar21;
                ppuVar2 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar2 = *ppuVar2 + 1;
              }
              iVar7._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)this_01,iVar7,&local_38);
              }
              else {
                *iVar7._M_current = local_38;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar7._M_current + 1;
              }
              iVar8._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar8,
                           &__args->smoothing_group_id);
              }
              else {
                *iVar8._M_current = __args->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
            }
            else {
              pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar25 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
              lVar31 = 2;
              lVar29 = 1;
              pvVar26 = pvVar17;
              uVar18 = 1;
              do {
                lVar30 = (long)pvVar26->v_idx;
                iVar12 = 7;
                if (lVar30 * 3 + 2U < uVar25) {
                  uVar22 = lVar20 * 0x5555555555555555 + uVar18;
                  if (uVar22 != 0) {
                    uVar22 = uVar18;
                  }
                  lVar23 = (long)pvVar17[uVar22].v_idx;
                  iVar12 = 7;
                  if ((lVar23 * 3 + 2U < uVar25) &&
                     (lVar19 = (long)pvVar17[(uVar18 + 1) % uVar21].v_idx, lVar19 * 3 + 2U < uVar25)
                     ) {
                    fVar38 = pfVar3[lVar19 * 3] - pfVar3[lVar23 * 3];
                    fVar37 = pfVar3[lVar23 * 3] - pfVar3[lVar30 * 3];
                    fVar34 = pfVar3[lVar19 * 3 + 1] - pfVar3[lVar23 * 3 + 1];
                    fVar36 = pfVar3[lVar23 * 3 + 1] - pfVar3[lVar30 * 3 + 1];
                    fVar39 = pfVar3[lVar19 * 3 + 2] - pfVar3[lVar23 * 3 + 2];
                    fVar33 = pfVar3[lVar23 * 3 + 2] - pfVar3[lVar30 * 3 + 2];
                    fVar35 = ABS(fVar36 * fVar39 - fVar34 * fVar33);
                    fVar33 = ABS(fVar33 * fVar38 - fVar39 * fVar37);
                    fVar34 = ABS(fVar34 * fVar37 - fVar36 * fVar38);
                    if (((1.1920929e-07 < fVar34) ||
                        ((1.1920929e-07 < fVar35 || (iVar12 = 0, 1.1920929e-07 < fVar33)))) &&
                       ((iVar12 = 5, fVar35 <= fVar34 || (fVar35 <= fVar33)))) {
                      lVar29 = lVar31;
                      if (fVar33 < fVar34) {
                        lVar29 = 1;
                      }
                      if (fVar35 < fVar34) {
                        lVar31 = lVar29;
                      }
                      lVar29 = 0;
                    }
                  }
                }
              } while (((iVar12 == 7) || (iVar12 == 0)) &&
                      (lVar30 = lVar20 * 0x5555555555555555 + uVar18, pvVar26 = pvVar26 + 1,
                      uVar18 = uVar18 + 1, lVar30 != 0));
              pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar18 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
              fVar33 = 0.0;
              lVar30 = 1;
              pvVar26 = pvVar17;
              do {
                lVar23 = 0;
                if (uVar21 - lVar30 != 0) {
                  lVar23 = lVar30;
                }
                lVar19 = (long)pvVar26->v_idx * 3;
                uVar25 = lVar19 + lVar29;
                if ((uVar25 < uVar18) && (uVar22 = lVar19 + lVar31, uVar22 < uVar18)) {
                  lVar23 = (long)pvVar17[lVar23].v_idx * 3;
                  uVar15 = lVar23 + lVar29;
                  if ((uVar15 < uVar18) && (uVar28 = lVar23 + lVar31, uVar28 < uVar18)) {
                    fVar33 = fVar33 + (pfVar3[uVar25] * pfVar3[uVar28] -
                                      pfVar3[uVar15] * pfVar3[uVar22]) * 0.5;
                  }
                }
                lVar23 = (lVar20 * 0x5555555555555555 - (ulong)(uVar21 == 0)) + lVar30;
                lVar30 = lVar30 + 1;
                pvVar26 = pvVar26 + 1;
              } while (lVar23 != 0);
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                        ((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          *)&remainingFace,
                         (vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          *)__x);
              ind[0].vn_idx = -1;
              ind[1].v_idx = -1;
              ind[1].vt_idx = -1;
              ind[1].vn_idx = -1;
              vx[1] = -NAN;
              vx[2] = -NAN;
              ind[0].v_idx = -1;
              ind[0].vt_idx = -1;
              ind[2].v_idx = -1;
              lVar20 = (long)remainingFace.vertex_indices.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_;
              uVar18 = (lVar20 >> 2) * -0x5555555555555555;
              if ((3 < uVar18) &&
                 (lVar30 = (long)(__args->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__args->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start, lVar30 != 0)) {
                uVar21 = (lVar30 >> 2) * -0x5555555555555555;
                uVar22 = 0;
                uVar25 = ((long)remainingFace.vertex_indices.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_ >> 2
                         ) * -0x5555555555555555;
                do {
                  uVar15 = uVar18;
                  uVar18 = uVar15;
                  if (uVar22 < uVar15) {
                    uVar18 = 0;
                  }
                  uVar22 = uVar22 - uVar18;
                  pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar18 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
                  prVar27 = vx + 1;
                  lVar20 = 0;
                  do {
                    uVar28 = (uVar22 + lVar20) % uVar15;
                    prVar27[2] = *(real_t *)(remainingFace._0_8_ + 8 + uVar28 * 0xc);
                    uVar4 = *(undefined8 *)(remainingFace._0_8_ + uVar28 * 0xc);
                    *(undefined8 *)prVar27 = uVar4;
                    iVar12 = ind[1].vn_idx;
                    lVar30 = (long)(int)uVar4 * 3;
                    uVar28 = lVar30 + lVar29;
                    if ((uVar28 < uVar18) && (uVar16 = lVar30 + lVar31, uVar16 < uVar18)) {
                      local_b4[lVar20] = pfVar3[uVar28];
                      fVar34 = pfVar3[uVar16];
                    }
                    else {
                      local_b4[lVar20] = 0.0;
                      fVar34 = 0.0;
                    }
                    local_ec[lVar20] = fVar34;
                    lVar20 = lVar20 + 1;
                    prVar27 = prVar27 + 3;
                  } while (lVar20 != 3);
                  uVar21 = uVar21 - 1;
                  if (uVar25 != uVar15) {
                    uVar21 = uVar15;
                  }
                  if (0.0 <= ((vy[0] - local_ec[1]) * (local_b4[1] - local_b4[0]) -
                             (vx[0] - local_b4[1]) * (local_ec[1] - local_ec[0])) * fVar33) {
                    if (3 < uVar15) {
                      pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar18 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
                      uVar25 = 3;
                      bVar24 = false;
                      do {
                        lVar20 = (long)*(int *)(remainingFace._0_8_ +
                                               ((uVar25 + uVar22) % uVar15) * 0xc) * 3;
                        uVar28 = lVar20 + lVar29;
                        iVar13 = 0x12;
                        if ((uVar28 < uVar18) && (uVar16 = lVar20 + lVar31, uVar16 < uVar18)) {
                          fVar34 = pfVar3[uVar16];
                          bVar11 = false;
                          lVar20 = 2;
                          lVar30 = 0;
                          do {
                            fVar35 = local_ec[lVar30];
                            if ((fVar34 < fVar35 == local_ec[lVar20] <= fVar34) &&
                               (pfVar3[uVar28] <
                                ((fVar34 - fVar35) * (local_b4[lVar20] - local_b4[lVar30])) /
                                (local_ec[lVar20] - fVar35) + local_b4[lVar30])) {
                              bVar11 = !bVar11;
                            }
                            lVar23 = lVar30 + 1;
                            lVar20 = lVar30;
                            lVar30 = lVar23;
                          } while (lVar23 != 3);
                          if (bVar11) {
                            bVar24 = true;
                          }
                          iVar13 = (uint)bVar11 << 4;
                        }
                      } while (((iVar13 == 0x12) || (iVar13 == 0)) &&
                              (uVar25 = uVar25 + 1, uVar25 != uVar15));
                      if (bVar24) goto LAB_0011750c;
                    }
                    ind[2].vt_idx = (int)vx[1];
                    ind[2].vn_idx = ind[0].v_idx;
                    idx0.vertex_index = (int)vx[2];
                    idx0.normal_index = ind[0].vt_idx;
                    idx0.texcoord_index = ind[1].v_idx;
                    idx1.vertex_index = ind[0].vn_idx;
                    idx1.normal_index = ind[1].vt_idx;
                    idx1.texcoord_index = ind[2].v_idx;
                    iVar5._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar5._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>
                                ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                                 iVar5,(index_t *)&ind[2].vt_idx);
                    }
                    else {
                      (iVar5._M_current)->texcoord_index = (int)vx[2];
                      (iVar5._M_current)->vertex_index = (int)vx[1];
                      (iVar5._M_current)->normal_index = ind[0].v_idx;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    iVar5._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar5._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>
                                ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                                 iVar5,(index_t *)&idx0.normal_index);
                    }
                    else {
                      (iVar5._M_current)->texcoord_index = idx1.vertex_index;
                      (iVar5._M_current)->vertex_index = idx0.normal_index;
                      (iVar5._M_current)->normal_index = idx0.texcoord_index;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    iVar5._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar5._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>
                                ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                                 iVar5,(index_t *)&idx1.normal_index);
                    }
                    else {
                      (iVar5._M_current)->texcoord_index = iVar12;
                      (iVar5._M_current)->vertex_index = idx1.normal_index;
                      (iVar5._M_current)->normal_index = idx1.texcoord_index;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    local_31 = '\x03';
                    iVar6._M_current =
                         (shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar6._M_current ==
                        (shape->mesh).num_face_vertices.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_realloc_insert<unsigned_char>(this_00,iVar6,&local_31);
                    }
                    else {
                      *iVar6._M_current = '\x03';
                      ppuVar2 = &(shape->mesh).num_face_vertices.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar2 = *ppuVar2 + 1;
                    }
                    iVar7._M_current =
                         (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)this_01,iVar7,&local_38);
                    }
                    else {
                      *iVar7._M_current = local_38;
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                    }
                    iVar8._M_current =
                         (shape->mesh).smoothing_group_ids.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar8._M_current ==
                        (shape->mesh).smoothing_group_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar8,
                                 &__args->smoothing_group_id);
                    }
                    else {
                      *iVar8._M_current = __args->smoothing_group_id;
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                    }
                    uVar18 = (uVar22 + 1) % uVar15;
                    while (uVar25 = uVar18 + 1, uVar25 < uVar15) {
                      *(undefined4 *)(remainingFace._0_8_ + 8 + uVar18 * 0xc) =
                           *(undefined4 *)(remainingFace._0_8_ + 8 + uVar25 * 0xc);
                      *(undefined8 *)(remainingFace._0_8_ + uVar18 * 0xc) =
                           *(undefined8 *)(remainingFace._0_8_ + uVar25 * 0xc);
                      uVar18 = uVar25;
                    }
                    remainingFace.vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         remainingFace.vertex_indices.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start + -1;
                  }
                  else {
LAB_0011750c:
                    uVar22 = uVar22 + 1;
                  }
                  lVar20 = (long)remainingFace.vertex_indices.
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_;
                  uVar18 = (lVar20 >> 2) * -0x5555555555555555;
                } while ((3 < uVar18) && (uVar25 = uVar15, uVar21 != 0));
              }
              uVar18 = (ulong)(uint)vy[2];
              if (lVar20 == 0x24) {
                ind[2].vt_idx = *(int *)remainingFace._0_8_;
                idx0.vertex_index = *(int *)(remainingFace._0_8_ + 4);
                ind[2].vn_idx = *(int *)(remainingFace._0_8_ + 8);
                idx0.normal_index = *(int *)(remainingFace._0_8_ + 0xc);
                idx1.vertex_index = *(int *)(remainingFace._0_8_ + 0x10);
                idx0.texcoord_index = *(int *)(remainingFace._0_8_ + 0x14);
                idx1.normal_index = *(int *)(remainingFace._0_8_ + 0x18);
                iVar12 = *(int *)(remainingFace._0_8_ + 0x1c);
                idx1.texcoord_index = *(int *)(remainingFace._0_8_ + 0x20);
                iVar5._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>
                            ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar5
                             ,(index_t *)&ind[2].vt_idx);
                }
                else {
                  (iVar5._M_current)->texcoord_index = idx0.vertex_index;
                  (iVar5._M_current)->vertex_index = ind[2].vt_idx;
                  (iVar5._M_current)->normal_index = ind[2].vn_idx;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                iVar5._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>
                            ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar5
                             ,(index_t *)&idx0.normal_index);
                }
                else {
                  (iVar5._M_current)->texcoord_index = idx1.vertex_index;
                  (iVar5._M_current)->vertex_index = idx0.normal_index;
                  (iVar5._M_current)->normal_index = idx0.texcoord_index;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                iVar5._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>
                            ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar5
                             ,(index_t *)&idx1.normal_index);
                }
                else {
                  (iVar5._M_current)->texcoord_index = iVar12;
                  (iVar5._M_current)->vertex_index = idx1.normal_index;
                  (iVar5._M_current)->normal_index = idx1.texcoord_index;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                local_31 = '\x03';
                iVar6._M_current =
                     (shape->mesh).num_face_vertices.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (shape->mesh).num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  _M_realloc_insert<unsigned_char>(this_00,iVar6,&local_31);
                }
                else {
                  *iVar6._M_current = '\x03';
                  ppuVar2 = &(shape->mesh).num_face_vertices.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar2 = *ppuVar2 + 1;
                }
                iVar7._M_current =
                     (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)this_01,iVar7,&local_38);
                }
                else {
                  *iVar7._M_current = local_38;
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                }
                iVar8._M_current =
                     (shape->mesh).smoothing_group_ids.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar8,
                             &__args->smoothing_group_id);
                }
                else {
                  *iVar8._M_current = __args->smoothing_group_id;
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                }
              }
              if (remainingFace._0_8_ != 0) {
                operator_delete((void *)remainingFace._0_8_,
                                (long)remainingFace.vertex_indices.
                                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                remainingFace._0_8_);
              }
            }
          }
          uVar32 = uVar32 + 1;
          pfVar14 = (prim_group->faceGroup).
                    super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar32 < (ulong)((long)(prim_group->faceGroup).
                                        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar14
                                 >> 5));
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,tags);
    }
    if (((prim_group->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (prim_group->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((prim_group->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prim_group->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      uVar18 = 0;
      do {
        p_Var9 = (prim_group->lineGroup).
                 super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar17 = *(pointer *)
                   &p_Var9[uVar18].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var9[uVar18].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) == pvVar17) {
          uVar32 = 0;
        }
        else {
          lVar20 = 8;
          uVar21 = 0;
          do {
            vx[1] = *(real_t *)((long)pvVar17 + lVar20 + -8);
            vx[2] = *(real_t *)((long)&pvVar17->v_idx + lVar20);
            ind[0].v_idx = *(int *)((long)pvVar17 + lVar20 + -4);
            iVar5._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines,
                         iVar5,(index_t *)(vx + 1));
            }
            else {
              (iVar5._M_current)->texcoord_index = ind[0].v_idx;
              (iVar5._M_current)->vertex_index = (int)vx[1];
              (iVar5._M_current)->normal_index = (int)vx[2];
              ppiVar1 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar1 = *ppiVar1 + 1;
            }
            uVar21 = uVar21 + 1;
            p_Var9 = (prim_group->lineGroup).
                     super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pvVar17 = *(pointer *)
                       &p_Var9[uVar18].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar32 = ((long)*(pointer *)
                             ((long)&p_Var9[uVar18].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar17 >> 2) * -0x5555555555555555;
            lVar20 = lVar20 + 0xc;
          } while (uVar21 < uVar32);
        }
        vx[1] = (real_t)uVar32;
        iVar7._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&(shape->lines).num_line_vertices,iVar7,(int *)(vx + 1));
        }
        else {
          *iVar7._M_current = (int)vx[1];
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)(((long)(prim_group->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(prim_group->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if (((prim_group->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (prim_group->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((prim_group->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prim_group->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      uVar18 = 0;
      do {
        p_Var10 = (prim_group->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar17 = *(pointer *)
                   &p_Var10[uVar18].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var10[uVar18].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) != pvVar17) {
          lVar20 = 8;
          uVar32 = 0;
          do {
            vx[1] = *(real_t *)((long)pvVar17 + lVar20 + -8);
            vx[2] = *(real_t *)((long)&pvVar17->v_idx + lVar20);
            ind[0].v_idx = *(int *)((long)pvVar17 + lVar20 + -4);
            iVar5._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points
                         ,iVar5,(index_t *)(vx + 1));
            }
            else {
              (iVar5._M_current)->texcoord_index = ind[0].v_idx;
              (iVar5._M_current)->vertex_index = (int)vx[1];
              (iVar5._M_current)->normal_index = (int)vx[2];
              ppiVar1 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar1 = *ppiVar1 + 1;
            }
            uVar32 = uVar32 + 1;
            p_Var10 = (prim_group->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar17 = *(pointer *)
                       &p_Var10[uVar18].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            lVar20 = lVar20 + 0xc;
          } while (uVar32 < (ulong)(((long)*(pointer *)
                                            ((long)&p_Var10[uVar18].vertex_indices.
                                                                                                        
                                                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                                  ._M_impl + 8) - (long)pvVar17 >> 2) *
                                   -0x5555555555555555));
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)(((long)(prim_group->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(prim_group->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  return (bool)(SUB41(vy[1],0) ^ 1);
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}